

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# verStream.c
# Opt level: O0

Ver_Stream_t * Ver_StreamAlloc(char *pFileName)

{
  FILE *__stream;
  long lVar1;
  void *pvVar2;
  long local_40;
  int local_38;
  int RetValue;
  int nCharsToRead;
  FILE *pFile;
  Ver_Stream_t *p;
  char *pFileName_local;
  
  __stream = fopen(pFileName,"rb");
  if (__stream == (FILE *)0x0) {
    printf("Ver_StreamAlloc(): Cannot open input file \"%s\".\n",pFileName);
    pFileName_local = (char *)0x0;
  }
  else {
    pFileName_local = (char *)malloc(0x10060);
    memset(pFileName_local,0,0x10060);
    *(char **)pFileName_local = pFileName;
    *(FILE **)(pFileName_local + 8) = __stream;
    fseek(__stream,0,2);
    lVar1 = ftell(__stream);
    *(long *)(pFileName_local + 0x10) = lVar1;
    rewind(__stream);
    pvVar2 = malloc(0x100001);
    *(void **)(pFileName_local + 0x30) = pvVar2;
    pFileName_local[0x28] = '\0';
    pFileName_local[0x29] = '\0';
    pFileName_local[0x2a] = '\x10';
    pFileName_local[0x2b] = '\0';
    pFileName_local[0x2c] = '\0';
    pFileName_local[0x2d] = '\0';
    pFileName_local[0x2e] = '\0';
    pFileName_local[0x2f] = '\0';
    *(undefined8 *)(pFileName_local + 0x38) = *(undefined8 *)(pFileName_local + 0x30);
    if (*(long *)(pFileName_local + 0x10) < 0x100000) {
      local_38 = (int)*(undefined8 *)(pFileName_local + 0x10);
    }
    else {
      local_38 = 0x100000;
    }
    fread(*(void **)(pFileName_local + 0x30),(long)local_38,1,*(FILE **)(pFileName_local + 8));
    *(long *)(pFileName_local + 0x18) = (long)local_38;
    *(long *)(pFileName_local + 0x40) = *(long *)(pFileName_local + 0x30) + (long)local_38;
    if (*(long *)(pFileName_local + 0x18) == *(long *)(pFileName_local + 0x10)) {
      local_40 = *(long *)(pFileName_local + 0x40);
    }
    else {
      local_40 = *(long *)(pFileName_local + 0x30) + 0xf0000;
    }
    *(long *)(pFileName_local + 0x48) = local_40;
    pFileName_local[0x20] = '\x01';
    pFileName_local[0x21] = '\0';
    pFileName_local[0x22] = '\0';
    pFileName_local[0x23] = '\0';
    pFileName_local[0x24] = '\0';
    pFileName_local[0x25] = '\0';
    pFileName_local[0x26] = '\0';
    pFileName_local[0x27] = '\0';
  }
  return (Ver_Stream_t *)pFileName_local;
}

Assistant:

Ver_Stream_t * Ver_StreamAlloc( char * pFileName )
{
    Ver_Stream_t * p;
    FILE * pFile;
    int nCharsToRead;
    int RetValue;
    // check if the file can be opened
    pFile = fopen( pFileName, "rb" );
    if ( pFile == NULL )
    {
        printf( "Ver_StreamAlloc(): Cannot open input file \"%s\".\n", pFileName );
        return NULL;
    }
    // start the file reader    
    p = ABC_ALLOC( Ver_Stream_t, 1 );
    memset( p, 0, sizeof(Ver_Stream_t) );
    p->pFileName   = pFileName;
    p->pFile       = pFile;
    // get the file size, in bytes
    fseek( pFile, 0, SEEK_END );  
    p->nFileSize = ftell( pFile );  
    rewind( pFile ); 
    // allocate the buffer
    p->pBuffer = ABC_ALLOC( char, VER_BUFFER_SIZE+1 );
    p->nBufferSize = VER_BUFFER_SIZE;
    p->pBufferCur  = p->pBuffer;
    // determine how many chars to read
    nCharsToRead = VER_MINIMUM(p->nFileSize, VER_BUFFER_SIZE);
    // load the first part into the buffer
    RetValue = fread( p->pBuffer, nCharsToRead, 1, p->pFile );
    p->nFileRead = nCharsToRead;
    // set the ponters to the end and the stopping point
    p->pBufferEnd  = p->pBuffer + nCharsToRead;
    p->pBufferStop = (p->nFileRead == p->nFileSize)? p->pBufferEnd : p->pBuffer + VER_BUFFER_SIZE - VER_OFFSET_SIZE;
    // start the arrays
    p->nLineCounter = 1; // 1-based line counting
    return p;
}